

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

void __thiscall cppnet::BaseLogger::FreeLog(BaseLogger *this,Log *log)

{
  element_type *peVar1;
  size_t sVar2;
  void *del;
  Log *local_28;
  Log *local_20;
  
  local_28 = log;
  sVar2 = ThreadSafeQueue<cppnet::Log_*>::Size(&this->_cache_queue);
  if (this->_cache_size < sVar2) {
    peVar1 = (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_20 = log;
    (*peVar1->_vptr_Alloter[5])(peVar1,&local_20,0);
  }
  else {
    log->_len = (uint)this->_block_size;
    ThreadSafeQueue<cppnet::Log_*>::Push(&this->_cache_queue,&local_28);
  }
  return;
}

Assistant:

void BaseLogger::FreeLog(Log* log) {
    if (_cache_queue.Size() > _cache_size) {
        void* del = (void*)log;
        _allocter->Free(del);

    } else {
        log->_len = _block_size;
        _cache_queue.Push(log);
    }
}